

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O2

bool lunasvg::matchSimpleSelector(SimpleSelector *selector,SVGElement *element)

{
  vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_> *pvVar1;
  pointer pAVar2;
  pointer pPVar3;
  pointer pSVar4;
  string *psVar5;
  SVGElement *pSVar6;
  vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *subSelector;
  pointer pvVar7;
  AttributeSelector *sel;
  pointer pAVar8;
  SimpleSelector *simpleSelector;
  pointer pSVar9;
  PseudoClassSelector *sel_1;
  pointer pPVar10;
  bool bVar11;
  string_view local_60;
  string_view local_50;
  pointer local_40;
  SimpleSelector *local_38;
  
  if ((selector->id == Star) || (selector->id == element->m_id)) {
    pAVar2 = (selector->attributeSelectors).
             super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = selector;
    for (pAVar8 = (selector->attributeSelectors).
                  super__Vector_base<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar8 != pAVar2; pAVar8 = pAVar8 + 1)
    {
      psVar5 = SVGElement::getAttribute_abi_cxx11_(element,pAVar8->id);
      switch(pAVar8->matchType) {
      case None:
        if (psVar5->_M_string_length != 0) goto LAB_00118b18;
        goto switchD_001189d7_default;
      case Equals:
        local_50._M_str = (psVar5->_M_dataplus)._M_p;
        local_50._M_len = psVar5->_M_string_length;
        local_60._M_str = (pAVar8->value)._M_dataplus._M_p;
        local_60._M_len = (pAVar8->value)._M_string_length;
        bVar11 = equals(&local_50,&local_60);
        break;
      case Contains:
        local_50._M_str = (psVar5->_M_dataplus)._M_p;
        local_50._M_len = psVar5->_M_string_length;
        local_60._M_str = (pAVar8->value)._M_dataplus._M_p;
        local_60._M_len = (pAVar8->value)._M_string_length;
        bVar11 = contains(&local_50,&local_60);
        break;
      case Includes:
        local_50._M_str = (psVar5->_M_dataplus)._M_p;
        local_50._M_len = psVar5->_M_string_length;
        local_60._M_str = (pAVar8->value)._M_dataplus._M_p;
        local_60._M_len = (pAVar8->value)._M_string_length;
        bVar11 = includes(&local_50,&local_60);
        break;
      case StartsWith:
        local_50._M_str = (psVar5->_M_dataplus)._M_p;
        local_50._M_len = psVar5->_M_string_length;
        local_60._M_str = (pAVar8->value)._M_dataplus._M_p;
        local_60._M_len = (pAVar8->value)._M_string_length;
        bVar11 = startswith(&local_50,&local_60);
        break;
      case EndsWith:
        local_50._M_str = (psVar5->_M_dataplus)._M_p;
        local_50._M_len = psVar5->_M_string_length;
        local_60._M_str = (pAVar8->value)._M_dataplus._M_p;
        local_60._M_len = (pAVar8->value)._M_string_length;
        bVar11 = endswith(&local_50,&local_60);
        break;
      case DashEquals:
        local_50._M_str = (psVar5->_M_dataplus)._M_p;
        local_50._M_len = psVar5->_M_string_length;
        local_60._M_str = (pAVar8->value)._M_dataplus._M_p;
        local_60._M_len = (pAVar8->value)._M_string_length;
        bVar11 = dashequals(&local_50,&local_60);
        break;
      default:
        goto switchD_001189d7_default;
      }
      if (bVar11 == false) goto switchD_001189d7_default;
LAB_00118b18:
    }
    pvVar1 = &local_38->pseudoClassSelectors;
    pPVar3 = (local_38->pseudoClassSelectors).
             super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_38 = (SimpleSelector *)&element->m_children;
    for (pPVar10 = (pvVar1->
                   super__Vector_base<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
                   )._M_impl.super__Vector_impl_data._M_start; bVar11 = pPVar10 == pPVar3, !bVar11;
        pPVar10 = pPVar10 + 1) {
      switch(pPVar10->type) {
      case Empty:
        if ((SimpleSelector *)
            (((_List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
               *)&local_38->combinator)->_M_impl)._M_node.super__List_node_base._M_next != local_38)
        {
          return bVar11;
        }
        break;
      case Root:
        pSVar6 = (element->super_SVGNode).m_parentElement;
        goto joined_r0x00118c72;
      case Is:
        local_40 = (pPVar10->subSelectors).
                   super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        for (pvVar7 = (pPVar10->subSelectors).
                      super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pvVar7 != local_40;
            pvVar7 = pvVar7 + 1) {
          pSVar9 = (pvVar7->
                   super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pSVar4 = (pvVar7->
                   super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          while (pSVar9 != pSVar4) {
            bVar11 = matchSimpleSelector(pSVar9,element);
            pSVar9 = pSVar9 + 1;
            if (!bVar11) goto switchD_001189d7_default;
          }
        }
        break;
      case Not:
        local_40 = (pPVar10->subSelectors).
                   super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        for (pvVar7 = (pPVar10->subSelectors).
                      super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pvVar7 != local_40;
            pvVar7 = pvVar7 + 1) {
          pSVar9 = (pvVar7->
                   super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pSVar4 = (pvVar7->
                   super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          while (pSVar9 != pSVar4) {
            bVar11 = matchSimpleSelector(pSVar9,element);
            pSVar9 = pSVar9 + 1;
            if (bVar11) goto switchD_001189d7_default;
          }
        }
        break;
      case FirstChild:
        pSVar6 = SVGElement::previousElement(element);
        goto joined_r0x00118c72;
      case OnlyChild:
        pSVar6 = SVGElement::previousElement(element);
        if (pSVar6 != (SVGElement *)0x0) {
          return bVar11;
        }
      case LastChild:
        pSVar6 = SVGElement::nextElement(element);
joined_r0x00118c72:
        if (pSVar6 != (SVGElement *)0x0) {
          return bVar11;
        }
        break;
      case FirstOfType:
        while (pSVar6 = SVGElement::previousElement(element), pSVar6 != (SVGElement *)0x0) {
          if (pSVar6->m_id == element->m_id) goto switchD_001189d7_default;
        }
        break;
      case LastOfType:
        while (pSVar6 = SVGElement::nextElement(element), pSVar6 != (SVGElement *)0x0) {
          if (pSVar6->m_id == element->m_id) goto switchD_001189d7_default;
        }
        break;
      default:
        goto switchD_00118b60_default;
      }
    }
  }
  else {
switchD_001189d7_default:
    bVar11 = false;
  }
switchD_00118b60_default:
  return bVar11;
}

Assistant:

static bool matchSimpleSelector(const SimpleSelector& selector, const SVGElement* element)
{
    if(selector.id != ElementID::Star && selector.id != element->id())
        return false;
    for(const auto& sel : selector.attributeSelectors) {
        if(!matchAttributeSelector(sel, element)) {
            return false;
        }
    }

    for(const auto& sel : selector.pseudoClassSelectors) {
        if(!matchPseudoClassSelector(sel, element)) {
            return false;
        }
    }

    return true;
}